

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int websocket_connect(char *address,websocket_settings_s settings)

{
  http_settings_s arg_settings;
  websocket_settings_s *url;
  intptr_t iVar1;
  code *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  void *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  void *local_18;
  websocket_settings_s *s;
  char *address_local;
  
  s = (websocket_settings_s *)address;
  local_18 = fio_malloc(0x30);
  memcpy(local_18,&settings,0x30);
  url = s;
  memset(&local_98,0,0x80);
  local_98 = on_websocket_http_connected;
  local_88 = on_websocket_http_connected;
  pcStack_80 = on_websocket_http_connection_finished;
  local_78 = local_18;
  arg_settings.on_upgrade = (_func_void_http_s_ptr_char_ptr_size_t *)uStack_90;
  arg_settings.on_request = on_websocket_http_connected;
  arg_settings.on_response = on_websocket_http_connected;
  arg_settings.on_finish = on_websocket_http_connection_finished;
  arg_settings.udata = local_18;
  arg_settings.public_folder = (char *)uStack_70;
  arg_settings.public_folder_length = local_68;
  arg_settings.max_header_size = uStack_60;
  arg_settings.max_body_size = local_58;
  arg_settings.max_clients = uStack_50;
  arg_settings.tls = (void *)local_48;
  arg_settings.reserved1 = uStack_40;
  arg_settings.reserved2 = local_38;
  arg_settings.reserved3 = uStack_30;
  arg_settings.ws_max_msg_size = local_28;
  arg_settings.timeout = (undefined1)uStack_20;
  arg_settings.ws_timeout = uStack_20._1_1_;
  arg_settings.log = uStack_20._2_1_;
  arg_settings.is_client = uStack_20._3_1_;
  arg_settings._124_4_ = uStack_20._4_4_;
  iVar1 = http_connect((char *)url,(char *)0x0,arg_settings);
  return (int)iVar1;
}

Assistant:

int websocket_connect(const char *address, websocket_settings_s settings) {
  websocket_settings_s *s = fio_malloc(sizeof(*s));
  *s = settings;
  return http_connect(address, NULL, .on_request = on_websocket_http_connected,
                      .on_response = on_websocket_http_connected,
                      .on_finish = on_websocket_http_connection_finished,
                      .udata = s);
}